

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_64.h
# Opt level: O0

void fiat_p256_selectznz(uint64_t *out1,fiat_p256_uint1 arg1,uint64_t *arg2,uint64_t *arg3)

{
  uint64_t local_48;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t *arg3_local;
  uint64_t *arg2_local;
  uint64_t *puStack_10;
  fiat_p256_uint1 arg1_local;
  uint64_t *out1_local;
  
  x1 = (uint64_t)arg3;
  arg3_local = arg2;
  arg2_local._7_1_ = arg1;
  puStack_10 = out1;
  fiat_p256_cmovznz_u64(&x2,arg1,*arg2,*arg3);
  fiat_p256_cmovznz_u64(&x3,arg2_local._7_1_,arg3_local[1],*(uint64_t *)(x1 + 8));
  fiat_p256_cmovznz_u64(&x4,arg2_local._7_1_,arg3_local[2],*(uint64_t *)(x1 + 0x10));
  fiat_p256_cmovznz_u64(&local_48,arg2_local._7_1_,arg3_local[3],*(uint64_t *)(x1 + 0x18));
  *puStack_10 = x2;
  puStack_10[1] = x3;
  puStack_10[2] = x4;
  puStack_10[3] = local_48;
  return;
}

Assistant:

static FIAT_P256_FIAT_INLINE void fiat_p256_selectznz(uint64_t out1[4], fiat_p256_uint1 arg1, const uint64_t arg2[4], const uint64_t arg3[4]) {
  uint64_t x1;
  uint64_t x2;
  uint64_t x3;
  uint64_t x4;
  fiat_p256_cmovznz_u64(&x1, arg1, (arg2[0]), (arg3[0]));
  fiat_p256_cmovznz_u64(&x2, arg1, (arg2[1]), (arg3[1]));
  fiat_p256_cmovznz_u64(&x3, arg1, (arg2[2]), (arg3[2]));
  fiat_p256_cmovznz_u64(&x4, arg1, (arg2[3]), (arg3[3]));
  out1[0] = x1;
  out1[1] = x2;
  out1[2] = x3;
  out1[3] = x4;
}